

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * print_value(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char cVar1;
  char *pcVar2;
  
  if (item == (cJSON *)0x0) {
    return (char *)0x0;
  }
  cVar1 = (char)item->type;
  if (p == (printbuffer *)0x0) {
    switch(cVar1) {
    case '\x01':
      pcVar2 = "false";
      break;
    case '\x02':
      pcVar2 = "true";
      break;
    case '\x03':
    case '\x05':
    case '\x06':
    case '\a':
      return (char *)0x0;
    case '\x04':
      pcVar2 = "null";
      break;
    case '\b':
      p = (printbuffer *)0x0;
      goto LAB_00102f04;
    default:
      if (cVar1 == '\x10') {
        p = (printbuffer *)0x0;
LAB_00102f21:
        pcVar2 = print_string(item,p);
        return pcVar2;
      }
      if (cVar1 == ' ') {
        p = (printbuffer *)0x0;
LAB_00102f19:
        pcVar2 = print_array(item,depth,fmt,p);
        return pcVar2;
      }
      if (cVar1 != '@') {
        return (char *)0x0;
      }
      p = (printbuffer *)0x0;
LAB_00102ead:
      pcVar2 = print_object(item,depth,fmt,p);
      return pcVar2;
    }
    pcVar2 = cJSON_strdup(pcVar2);
    return pcVar2;
  }
  switch(cVar1) {
  case '\x01':
    pcVar2 = ensure(p,6);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    builtin_strncpy(pcVar2,"false",6);
    return pcVar2;
  case '\x02':
    pcVar2 = ensure(p,5);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    builtin_strncpy(pcVar2,"true",5);
    return pcVar2;
  case '\x03':
  case '\x05':
  case '\x06':
  case '\a':
    return (char *)0x0;
  case '\x04':
    pcVar2 = ensure(p,5);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    builtin_strncpy(pcVar2,"null",5);
    return pcVar2;
  case '\b':
    break;
  default:
    if (cVar1 == '\x10') goto LAB_00102f21;
    if (cVar1 == ' ') goto LAB_00102f19;
    if (cVar1 != '@') {
      return (char *)0x0;
    }
    goto LAB_00102ead;
  }
LAB_00102f04:
  pcVar2 = print_number(item,p);
  return pcVar2;
}

Assistant:

static char *print_value(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char *out=0;
	if (!item) return 0;
	if (p)
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	{out=ensure(p,5);	if (out) strcpy(out,"null");	break;}
			case cJSON_False:	{out=ensure(p,6);	if (out) strcpy(out,"false");	break;}
			case cJSON_True:	{out=ensure(p,5);	if (out) strcpy(out,"true");	break;}
			case cJSON_Number:	out=print_number(item,p);break;
			case cJSON_String:	out=print_string(item,p);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,p);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,p);break;
		}
	}
	else
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	out=cJSON_strdup("null");	break;
			case cJSON_False:	out=cJSON_strdup("false");break;
			case cJSON_True:	out=cJSON_strdup("true"); break;
			case cJSON_Number:	out=print_number(item,0);break;
			case cJSON_String:	out=print_string(item,0);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,0);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,0);break;
		}
	}
	return out;
}